

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void prune_dead_connections(Curl_easy *data)

{
  conncache *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  timediff_t tVar5;
  curltime cVar6;
  curltime older;
  curltime newer;
  prunedead prune;
  Curl_easy *local_38;
  connectdata *local_30;
  
  cVar6 = Curl_now();
  pcVar1 = (data->state).conn_cache;
  uVar2 = (pcVar1->last_cleanup).tv_sec;
  uVar3 = (pcVar1->last_cleanup).tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  older._12_4_ = 0;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar6._0_12_,0);
  newer.tv_usec = SUB124(cVar6._0_12_,8);
  tVar5 = Curl_timediff(newer,older);
  if (999 < tVar5) {
    local_30 = (connectdata *)0x0;
    local_38 = data;
    _Var4 = Curl_conncache_foreach(data,(data->state).conn_cache,&local_38,call_extract_if_dead);
    if (_Var4) {
      do {
        Curl_disconnect(data,local_30,true);
        _Var4 = Curl_conncache_foreach(data,(data->state).conn_cache,&local_38,call_extract_if_dead)
        ;
      } while (_Var4);
    }
    pcVar1 = (data->state).conn_cache;
    (pcVar1->last_cleanup).tv_sec = cVar6.tv_sec;
    (pcVar1->last_cleanup).tv_usec = cVar6.tv_usec;
  }
  return;
}

Assistant:

static void prune_dead_connections(struct Curl_easy *data)
{
  struct curltime now = Curl_now();
  time_t elapsed = Curl_timediff(now, data->state.conn_cache->last_cleanup);

  if(elapsed >= 1000L) {
    struct prunedead prune;
    prune.data = data;
    prune.extracted = NULL;
    while(Curl_conncache_foreach(data, data->state.conn_cache, &prune,
                                 call_extract_if_dead)) {
      /* disconnect it */
      (void)Curl_disconnect(data, prune.extracted, /* dead_connection */TRUE);
    }
    data->state.conn_cache->last_cleanup = now;
  }
}